

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O0

string * __thiscall
glu::parseVariableName_abi_cxx11_(string *__return_storage_ptr__,glu *this,char *nameWithPath)

{
  deBool dVar1;
  Token TVar2;
  TestError *this_00;
  undefined1 local_30 [8];
  VarTokenizer tokenizer;
  char *nameWithPath_local;
  
  tokenizer._16_8_ = this;
  VarTokenizer::VarTokenizer((VarTokenizer *)local_30,(char *)this);
  while( true ) {
    dVar1 = ::deGetFalse();
    if (dVar1 != 0) break;
    TVar2 = VarTokenizer::getToken((VarTokenizer *)local_30);
    if (TVar2 != TOKEN_IDENTIFIER) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      VarTokenizer::getIdentifier_abi_cxx11_(__return_storage_ptr__,(VarTokenizer *)local_30);
      VarTokenizer::~VarTokenizer((VarTokenizer *)local_30);
      return __return_storage_ptr__;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
             ,0x5d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

std::string parseVariableName (const char* nameWithPath)
{
	VarTokenizer tokenizer(nameWithPath);
	TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
	return tokenizer.getIdentifier();
}